

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall
QTextStreamPrivate::putNumber(QTextStreamPrivate *this,qulonglong number,bool negative)

{
  QLocale *this_00;
  uint uVar1;
  bool bVar2;
  NumberOptions NVar3;
  QLocalePrivate *pQVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QStringView lhs;
  QLatin1StringView rhs;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
          super_QFlagsStorage<QTextStream::NumberFlag>.i;
  uVar5 = (uVar1 & 1) * 0x80;
  uVar7 = uVar5 + 0x10;
  if ((int)CONCAT71(in_register_00000011,negative) != 0) {
    uVar7 = uVar5;
  }
  if ((uVar1 & 4) == 0) {
    uVar7 = uVar5;
  }
  uVar7 = (uVar1 & 8) * 0x20 + (uVar1 & 0x10) * 4 | uVar7;
  this_00 = &this->locale;
  QLocale::QLocale((QLocale *)&local_58,C,AnyScript,AnyCountry);
  bVar2 = QLocale::equals(this_00,(QLocale *)&local_58);
  if (bVar2) {
    QLocale::~QLocale((QLocale *)&local_58);
  }
  else {
    NVar3 = QLocale::numberOptions(this_00);
    QLocale::~QLocale((QLocale *)&local_58);
    uVar7 = (((uint)NVar3.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                    super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar7) ^ 0x20;
  }
  pQVar4 = (this_00->d).d.ptr;
  if ((pQVar4->ref)._q_value.super___atomic_base<int>._M_i != 1) {
    QSharedDataPointer<QLocalePrivate>::detach_helper(&this_00->d);
    pQVar4 = (this_00->d).d.ptr;
  }
  uVar1 = (this->params).integerBase;
  uVar5 = 10;
  if (uVar1 != 0) {
    uVar5 = uVar1;
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uVar6 = (ulong)uVar5;
  QLocaleData::unsLongLongToString(&local_58,pQVar4->m_data,number,-1,uVar5,-1,uVar7);
  if (negative) {
    QLocale::negativeSign(&local_70,this_00);
    if ((QChar *)local_70.d.ptr == (QChar *)0x0) {
      local_70.d.ptr = L"";
    }
    QString::insert(&local_58,0,(QChar *)local_70.d.ptr,local_70.d.size);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else if (((uVar5 == 8 && number == 0) &&
           (((this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
             super_QFlagsStorage<QTextStream::NumberFlag>.i & 1) != 0)) &&
          ((undefined1 *)local_58.d.size == (undefined1 *)0x1)) {
    lhs.m_size = (qsizetype)"0";
    lhs.m_data = (storage_type_conflict *)0x1;
    rhs.m_size = uVar6;
    rhs.m_data = (char *)0x1;
    bVar2 = QtPrivate::equalStrings((QtPrivate *)local_58.d.ptr,lhs,rhs);
    if (bVar2) {
      QString::insert(&local_58,0,(QChar)0x30);
    }
  }
  putString(this,(QChar *)local_58.d.ptr,local_58.d.size,true);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putNumber(qulonglong number, bool negative)
{
    unsigned flags = 0;
    const QTextStream::NumberFlags numberFlags = params.numberFlags;
    if (numberFlags & QTextStream::ShowBase)
        flags |= QLocaleData::ShowBase;
    // ForceSign is irrelevant when we'll be including a sign in any case:
    if ((numberFlags & QTextStream::ForceSign) && !negative)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags & QTextStream::UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags & QTextStream::UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;

    // Group digits. For backward compatibility, we skip this for the C locale.
    if (locale != QLocale::c() && !locale.numberOptions().testFlag(QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;

    const QLocaleData *dd = locale.d->m_data;
    int base = params.integerBase ? params.integerBase : 10;
    QString result = dd->unsLongLongToString(number, -1, base, -1, flags);
    if (negative) {
        result.prepend(locale.negativeSign());
    } else if (number == 0 && base == 8 && params.numberFlags & QTextStream::ShowBase
               && result == "0"_L1) {
        // Workaround for backward compatibility - in octal form with ShowBase
        // flag set, zero should get its 0 prefix before its 0 value, but
        // QLocalePrivate only adds the prefix if the number doesn't start with
        // a zero.
        result.prepend(u'0');
    }
    putString(result, true);
}